

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zt_ptr_array.c
# Opt level: O0

void * zt_ptr_array_get_idx(zt_ptr_array *array,int32_t idx)

{
  int32_t idx_local;
  zt_ptr_array *array_local;
  void *local_8;
  
  if (idx == -1) {
    local_8 = array->array[array->count + -1];
  }
  else if (idx < array->count) {
    local_8 = array->array[idx];
  }
  else {
    local_8 = (void *)0x0;
  }
  return local_8;
}

Assistant:

void *
zt_ptr_array_get_idx(zt_ptr_array * array, int32_t idx) {
    if (idx == -1) {
        /* return the last element */
        return array->array[array->count - 1];
    }

    if (idx >= array->count) {
        return NULL;
    }

    return array->array[idx];
}